

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::json::Value::Field::Reader>::setCapacity
          (Vector<capnp::json::Value::Field::Reader> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::json::Value::Field::Reader> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::json::Value::Field::Reader> newBuilder;
  size_t newSize_local;
  Vector<capnp::json::Value::Field::Reader> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<capnp::json::Value::Field::Reader>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::json::Value::Field::Reader>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::json::Value::Field::Reader>
            ((ArrayBuilder<capnp::json::Value::Field::Reader> *)local_38,(size_t)newBuilder.disposer
            );
  pAVar2 = mv<kj::ArrayBuilder<capnp::json::Value::Field::Reader>>(&this->builder);
  ArrayBuilder<capnp::json::Value::Field::Reader>::
  addAll<kj::ArrayBuilder<capnp::json::Value::Field::Reader>>
            ((ArrayBuilder<capnp::json::Value::Field::Reader> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::json::Value::Field::Reader>>
                     ((ArrayBuilder<capnp::json::Value::Field::Reader> *)local_38);
  ArrayBuilder<capnp::json::Value::Field::Reader>::operator=(&this->builder,pAVar2);
  ArrayBuilder<capnp::json::Value::Field::Reader>::~ArrayBuilder
            ((ArrayBuilder<capnp::json::Value::Field::Reader> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }